

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InvocationWriteReadCase::
genShaderMainBlock_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  char cVar1;
  string *psVar2;
  ostream *poVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  long lVar8;
  int iVar9;
  char *pcVar10;
  ulong uVar11;
  string localID;
  ostringstream buf;
  long *local_3f0;
  long local_3e8;
  long local_3e0;
  long lStack_3d8;
  long *local_3d0;
  undefined8 local_3c8;
  long local_3c0;
  undefined8 uStack_3b8;
  ulong local_3b0;
  ulong *local_3a8;
  long local_3a0;
  ulong local_398;
  long lStack_390;
  ulong *local_388;
  long local_380;
  ulong local_378 [2];
  long *local_368;
  long local_360;
  long local_358;
  long lStack_350;
  string *local_348;
  long *local_340 [2];
  long local_330 [2];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_348 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_320);
  if (0 < *(int *)((long)this + 0x90)) {
    iVar9 = 0;
    do {
      if (*(int *)((long)this + 0x78) == 0) {
        if (*(char *)((long)this + 0x7c) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,
                     "\tatomicAdd(sb_store.values[getIndex(gl_LocalInvocationID.xy, ",0x3d);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_320,iVar9);
          lVar8 = 0xf;
          pcVar10 = ")], groupNdx);\n";
        }
        else {
          if (*(char *)((long)this + 0x7c) != '\0') goto LAB_00493716;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,"\tsb_store.values[getIndex(gl_LocalInvocationID.xy, ",
                     0x33);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_320,iVar9);
          lVar8 = 0xf;
          pcVar10 = ")] = groupNdx;\n";
        }
LAB_004937f1:
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar10,lVar8);
      }
      else {
LAB_00493716:
        if (*(int *)((long)this + 0x78) == 1) {
          if (*(char *)((long)this + 0x7c) == '\x01') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,
                       "\timageAtomicAdd(u_image, getCoord(gl_LocalInvocationID.xy, ",0x3b);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_320,iVar9);
            lVar8 = 0x13;
            pcVar10 = "), int(groupNdx));\n";
          }
          else {
            if (*(char *)((long)this + 0x7c) != '\0') goto LAB_004937f9;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,
                       "\timageStore(u_image, getCoord(gl_LocalInvocationID.xy, ",0x37);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_320,iVar9);
            lVar8 = 0x23;
            pcVar10 = "), ivec4(int(groupNdx), 0, 0, 0));\n";
          }
          goto LAB_004937f1;
        }
      }
LAB_004937f9:
      iVar9 = iVar9 + 1;
    } while (iVar9 < *(int *)((long)this + 0x90));
  }
  InterInvocationTestCase::genBarrierSource_abi_cxx11_(local_1a8,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  if (0 < *(int *)((long)this + 0x90)) {
    local_3b0 = 0;
    iVar9 = 0;
    do {
      cVar1 = *(char *)((long)this + 0x7e);
      if (cVar1 == '\x01') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::operator<<(local_1a8,iVar9 + 1);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)local_340,0,(char *)0x0,0x98aa7b);
        local_368 = &local_358;
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_358 = *plVar6;
          lStack_350 = plVar4[3];
        }
        else {
          local_358 = *plVar6;
          local_368 = (long *)*plVar4;
        }
        local_360 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_368);
        local_3a8 = &local_398;
        puVar7 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar7) {
          local_398 = *puVar7;
          lStack_390 = plVar4[3];
        }
        else {
          local_398 = *puVar7;
          local_3a8 = (ulong *)*plVar4;
        }
        local_3a0 = plVar4[1];
        *plVar4 = (long)puVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::operator<<(local_1a8,(int)local_3b0);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar11 = 0xf;
        if (local_3a8 != &local_398) {
          uVar11 = local_398;
        }
        if (uVar11 < (ulong)(local_380 + local_3a0)) {
          uVar11 = 0xf;
          if (local_388 != local_378) {
            uVar11 = local_378[0];
          }
          if (uVar11 < (ulong)(local_380 + local_3a0)) goto LAB_00493a5f;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_388,0,(char *)0x0,(ulong)local_3a8);
        }
        else {
LAB_00493a5f:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_3a8,(ulong)local_388);
        }
        local_3d0 = &local_3c0;
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_3c0 = *plVar4;
          uStack_3b8 = puVar5[3];
        }
        else {
          local_3c0 = *plVar4;
          local_3d0 = (long *)*puVar5;
        }
        local_3c8 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)plVar4 = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_3d0);
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_3e0 = *plVar6;
          lStack_3d8 = plVar4[3];
          local_3f0 = &local_3e0;
        }
        else {
          local_3e0 = *plVar6;
          local_3f0 = (long *)*plVar4;
        }
        local_3e8 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
      }
      else {
        local_3f0 = &local_3e0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f0,"gl_LocalInvocationID.xy","");
      }
      if (cVar1 != '\0') {
        if (local_3d0 != &local_3c0) {
          operator_delete(local_3d0,local_3c0 + 1);
        }
        if (local_388 != local_378) {
          operator_delete(local_388,local_378[0] + 1);
        }
        if (cVar1 != '\0') {
          if (local_3a8 != &local_398) {
            operator_delete(local_3a8,local_398 + 1);
          }
          if (local_368 != &local_358) {
            operator_delete(local_368,local_358 + 1);
          }
          if (local_340[0] != local_330) {
            operator_delete(local_340[0],local_330[0] + 1);
          }
        }
      }
      if (*(int *)((long)this + 0x78) == 0) {
        if (*(char *)((long)this + 0x7c) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,
                     "\tallOk = allOk && (atomicExchange(sb_store.values[getIndex(",0x3b);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_320,(char *)local_3f0,local_3e8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar9);
          lVar8 = 0x15;
          pcVar10 = ")], 0) == groupNdx);\n";
        }
        else {
          if (*(char *)((long)this + 0x7c) != '\0') goto LAB_00493bdd;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,"\tallOk = allOk && (sb_store.values[getIndex(",0x2c);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_320,(char *)local_3f0,local_3e8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar9);
          lVar8 = 0x11;
          pcVar10 = ")] == groupNdx);\n";
        }
LAB_00493da3:
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar10,lVar8);
      }
      else {
LAB_00493bdd:
        if (*(int *)((long)this + 0x78) == 1) {
          if (*(char *)((long)this + 0x7c) == '\x01') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,
                       "\tallOk = allOk && (imageAtomicExchange(u_image, getCoord(",0x39);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_320,(char *)local_3f0,local_3e8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar9);
            lVar8 = 0x14;
            pcVar10 = "), 0) == groupNdx);\n";
          }
          else {
            if (*(char *)((long)this + 0x7c) != '\0') goto LAB_00493dab;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_320,"\tallOk = allOk && (imageLoad(u_image, getCoord(",0x2f)
            ;
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_320,(char *)local_3f0,local_3e8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar9);
            lVar8 = 0x13;
            pcVar10 = ")).x == groupNdx);\n";
          }
          goto LAB_00493da3;
        }
      }
LAB_00493dab:
      if (local_3f0 != &local_3e0) {
        operator_delete(local_3f0,local_3e0 + 1);
      }
      iVar9 = iVar9 + 1;
      local_3b0 = (ulong)((int)local_3b0 + 2);
    } while (iVar9 < *(int *)((long)this + 0x90));
  }
  psVar2 = local_348;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  return psVar2;
}

Assistant:

std::string InvocationWriteReadCase::genShaderMainBlock (void) const
{
	std::ostringstream buf;

	// write

	for (int ndx = 0; ndx < m_elementsPerInvocation; ++ndx)
	{
		if (m_storage == STORAGE_BUFFER && m_useAtomic)
			buf << "\tatomicAdd(sb_store.values[getIndex(gl_LocalInvocationID.xy, " << ndx << ")], groupNdx);\n";
		else if (m_storage == STORAGE_BUFFER && !m_useAtomic)
			buf << "\tsb_store.values[getIndex(gl_LocalInvocationID.xy, " << ndx << ")] = groupNdx;\n";
		else if (m_storage == STORAGE_IMAGE && m_useAtomic)
			buf << "\timageAtomicAdd(u_image, getCoord(gl_LocalInvocationID.xy, " << ndx << "), int(groupNdx));\n";
		else if (m_storage == STORAGE_IMAGE && !m_useAtomic)
			buf << "\timageStore(u_image, getCoord(gl_LocalInvocationID.xy, " << ndx << "), ivec4(int(groupNdx), 0, 0, 0));\n";
		else
			DE_ASSERT(DE_FALSE);
	}

	// barrier

	buf << genBarrierSource();

	// read

	for (int ndx = 0; ndx < m_elementsPerInvocation; ++ndx)
	{
		const std::string localID = (m_syncWithGroup) ? ("(gl_LocalInvocationID.xy + uvec2(" + de::toString(ndx+1) + ", " + de::toString(2*ndx) + ")) % gl_WorkGroupSize.xy") : ("gl_LocalInvocationID.xy");

		if (m_storage == STORAGE_BUFFER && m_useAtomic)
			buf << "\tallOk = allOk && (atomicExchange(sb_store.values[getIndex(" << localID << ", " << ndx << ")], 0) == groupNdx);\n";
		else if (m_storage == STORAGE_BUFFER && !m_useAtomic)
			buf << "\tallOk = allOk && (sb_store.values[getIndex(" << localID << ", " << ndx << ")] == groupNdx);\n";
		else if (m_storage == STORAGE_IMAGE && m_useAtomic)
			buf << "\tallOk = allOk && (imageAtomicExchange(u_image, getCoord(" << localID << ", " << ndx << "), 0) == groupNdx);\n";
		else if (m_storage == STORAGE_IMAGE && !m_useAtomic)
			buf << "\tallOk = allOk && (imageLoad(u_image, getCoord(" << localID << ", " << ndx << ")).x == groupNdx);\n";
		else
			DE_ASSERT(DE_FALSE);
	}

	return buf.str();
}